

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O2

Vector * CGSIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  double bNorm;
  double dVar1;
  Boolean BVar2;
  LASErrIdType LVar3;
  size_t Dim;
  Vector *pVVar4;
  int iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_208;
  Vector p;
  Vector r_;
  Vector r;
  Vector u;
  Vector u_;
  Vector q;
  Vector v_;
  Vector p_;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&r,"r",Dim,Normal,True);
  V_Constr(&r_,"r_",Dim,Normal,True);
  V_Constr(&p,"p",Dim,Normal,True);
  V_Constr(&q,"q",Dim,Normal,True);
  V_Constr(&u,"u",Dim,Normal,True);
  V_Constr(&u_,"u_",Dim,Normal,True);
  V_Constr(&v_,"v_",Dim,Normal,True);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar2 = Q_KerDefined(A);
    if (BVar2 != False) goto LAB_0010928c;
  }
  else {
LAB_0010928c:
    V_Constr(&p_,"p_",Dim,Normal,True);
  }
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar1 = l1Norm_V(x);
    auVar7._8_4_ = (int)(Dim >> 0x20);
    auVar7._0_8_ = Dim;
    auVar7._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar1 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    Asgn_VV(&r,pVVar4);
    if (PrecondProc == (PrecondProcType)0x0) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 == False) {
        Asgn_VV(&r_,&r);
        iVar5 = 0;
        local_208 = 0.0;
        while( true ) {
          dVar1 = l2Norm_V(&r);
          BVar2 = RTCResult(iVar5,dVar1,bNorm,CGSIterId);
          if ((BVar2 != False) || (MaxIter <= iVar5)) break;
          dVar1 = Mul_VV(&r_,&r);
          if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_001097e8;
          if (iVar5 == 0) {
            Asgn_VV(&u,&r);
            pVVar4 = &u;
          }
          else {
            local_208 = dVar1 / local_208;
            pVVar4 = Mul_SV(local_208,&q);
            pVVar4 = Add_VV(&r,pVVar4);
            Asgn_VV(&u,pVVar4);
            pVVar4 = Mul_SV(local_208,&p);
            pVVar4 = Add_VV(&q,pVVar4);
            pVVar4 = Mul_SV(local_208,pVVar4);
            pVVar4 = Add_VV(&u,pVVar4);
          }
          Asgn_VV(&p,pVVar4);
          pVVar4 = Mul_QV(A,&p);
          Asgn_VV(&v_,pVVar4);
          dVar6 = Mul_VV(&r_,&v_);
          dVar6 = dVar1 / dVar6;
          pVVar4 = Mul_SV(dVar6,&v_);
          pVVar4 = Sub_VV(&u,pVVar4);
          Asgn_VV(&q,pVVar4);
          pVVar4 = Add_VV(&u,&q);
          Asgn_VV(&u_,pVVar4);
          pVVar4 = Mul_SV(dVar6,&u_);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_QV(A,&u_);
          pVVar4 = Mul_SV(dVar6,pVVar4);
          SubAsgn_VV(&r,pVVar4);
          iVar5 = iVar5 + 1;
          local_208 = dVar1;
        }
        goto LAB_00109803;
      }
    }
    Asgn_VV(&r_,&r);
    iVar5 = 0;
    local_208 = 0.0;
    while( true ) {
      dVar1 = l2Norm_V(&r);
      BVar2 = RTCResult(iVar5,dVar1,bNorm,CGSIterId);
      if ((BVar2 != False) || (MaxIter <= iVar5)) break;
      dVar1 = Mul_VV(&r_,&r);
      if (ABS(dVar1) < 2.2250738585072014e-307) goto LAB_001097e8;
      if (iVar5 == 0) {
        pVVar4 = &u;
        Asgn_VV(pVVar4,&r);
      }
      else {
        local_208 = dVar1 / local_208;
        pVVar4 = Mul_SV(local_208,&q);
        pVVar4 = Add_VV(&r,pVVar4);
        Asgn_VV(&u,pVVar4);
        pVVar4 = Mul_SV(local_208,&p);
        pVVar4 = Add_VV(&q,pVVar4);
        pVVar4 = Mul_SV(local_208,pVVar4);
        pVVar4 = Add_VV(&u,pVVar4);
      }
      Asgn_VV(&p,pVVar4);
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&p_,&p);
      }
      else {
        (*PrecondProc)(A,&p_,&p,OmegaPrecond);
      }
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(&p_,A);
      }
      pVVar4 = Mul_QV(A,&p_);
      Asgn_VV(&v_,pVVar4);
      dVar6 = Mul_VV(&r_,&v_);
      dVar6 = dVar1 / dVar6;
      pVVar4 = Mul_SV(dVar6,&v_);
      pVVar4 = Sub_VV(&u,pVVar4);
      Asgn_VV(&q,pVVar4);
      pVVar4 = Add_VV(&u,&q);
      if (PrecondProc == (PrecondProcType)0x0) {
        Asgn_VV(&u_,pVVar4);
      }
      else {
        (*PrecondProc)(A,&u_,pVVar4,OmegaPrecond);
      }
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(&u_,A);
      }
      pVVar4 = Mul_SV(dVar6,&u_);
      AddAsgn_VV(x,pVVar4);
      pVVar4 = Mul_QV(A,&u_);
      pVVar4 = Mul_SV(dVar6,pVVar4);
      SubAsgn_VV(&r,pVVar4);
      iVar5 = iVar5 + 1;
      local_208 = dVar1;
    }
    goto LAB_00109803;
  }
  goto LAB_00109829;
LAB_001097e8:
  LASError(LASBreakdownErr,"CGSIter","Rho",(char *)0x0,(char *)0x0);
LAB_00109803:
  BVar2 = Q_KerDefined(A);
  if (BVar2 != False) {
    OrthoRightKer_VQ(x,A);
  }
LAB_00109829:
  V_Destr(&r);
  V_Destr(&r_);
  V_Destr(&p);
  V_Destr(&q);
  V_Destr(&u);
  V_Destr(&u_);
  V_Destr(&v_);
  if (PrecondProc == (PrecondProcType)0x0) {
    BVar2 = Q_KerDefined(A);
    if (BVar2 == False) goto LAB_001098a2;
  }
  V_Destr(&p_);
LAB_001098a2:
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGSIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, u, u_, v_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&u, "u", Dim, Normal, True);
    V_Constr(&u_, "u_", Dim, Normal, True);
    V_Constr(&v_, "v_", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&p_, "p_", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGS */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &p_, &p, OmegaPrecond);
	        else
		    Asgn_VV(&p_, &p);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&p_, A);
                Asgn_VV(&v_, Mul_QV(A, &p_));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &u_, Add_VV(&u, &q), OmegaPrecond);
	        else
		    Asgn_VV(&u_, Add_VV(&u, &q));
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&u_, A);
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        } else {
            /* plain CGS (p_ = p) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
                Asgn_VV(&v_, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
                Asgn_VV(&u_, Add_VV(&u, &q));
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
      
    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&u);
    V_Destr(&u_);
    V_Destr(&v_);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&p_);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}